

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_block_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1946179::ErrorBlockTest_DISABLED_Speed_Test::TestBody
          (ErrorBlockTest_DISABLED_Speed_Test *this)

{
  uint32_t range;
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int j;
  ulong uVar8;
  bool bVar9;
  ACMRandom rnd;
  int64_t ref_ssz;
  int64_t ssz;
  aom_usec_timer test_timer;
  aom_usec_timer ref_timer;
  tran_low_t coeff [4096];
  tran_low_t dqcoeff [4096];
  
  rnd.random_.state_ = (Random)0xbaba;
  range = 1 << ((char)(this->super_ErrorBlockTest).bit_depth_ + 7 & 0x1f);
  for (iVar6 = 0; iVar6 != 9; iVar6 = iVar6 + 1) {
    uVar4 = (ulong)(uint)(0x10 << ((byte)iVar6 & 0x1f));
    for (uVar3 = 0; uVar3 != 9; uVar3 = uVar3 + 1) {
      for (uVar8 = 0; uVar4 != uVar8; uVar8 = uVar8 + 1) {
        uVar1 = testing::internal::Random::Generate(&rnd.random_,2);
        if (uVar3 < 5) {
          uVar2 = testing::internal::Random::Generate(&rnd.random_,range);
          if (uVar1 == 0) {
            coeff[uVar8] = -uVar2;
            uVar1 = testing::internal::Random::Generate(&rnd.random_,range);
            uVar1 = -uVar1;
          }
          else {
            coeff[uVar8] = uVar2;
            uVar1 = testing::internal::Random::Generate(&rnd.random_,range);
          }
        }
        else {
          uVar2 = testing::internal::Random::Generate(&rnd.random_,0x4000);
          if (uVar1 == 0) {
            coeff[uVar8] = -uVar2;
            uVar1 = testing::internal::Random::Generate(&rnd.random_,0x4000);
            uVar1 = -uVar1;
          }
          else {
            coeff[uVar8] = uVar2;
            uVar1 = testing::internal::Random::Generate(&rnd.random_,0x4000);
          }
        }
        dqcoeff[uVar8] = uVar1;
      }
      ::aom_usec_timer_start(&ref_timer);
      iVar7 = 100000;
      while (bVar9 = iVar7 != 0, iVar7 = iVar7 + -1, bVar9) {
        (*(this->super_ErrorBlockTest).ref_error_block_op_)
                  (coeff,dqcoeff,uVar4,&ref_ssz,(this->super_ErrorBlockTest).bit_depth_);
      }
      ::aom_usec_timer_mark(&ref_timer);
      uVar8 = ::aom_usec_timer_elapsed(&ref_timer);
      ::aom_usec_timer_start(&test_timer);
      iVar7 = 100000;
      while (bVar9 = iVar7 != 0, iVar7 = iVar7 + -1, bVar9) {
        (*(this->super_ErrorBlockTest).error_block_op_)
                  (coeff,dqcoeff,uVar4,&ssz,(this->super_ErrorBlockTest).bit_depth_);
      }
      ::aom_usec_timer_mark(&test_timer);
      uVar5 = ::aom_usec_timer_elapsed(&test_timer);
      printf(" c_time=%d \t simd_time=%d \t gain=%d \n",uVar8,uVar5 & 0xffffffff,
             (long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) /
             (long)(int)uVar5 & 0xffffffff);
    }
  }
  return;
}

Assistant:

TEST_P(ErrorBlockTest, DISABLED_Speed) {
  ACMRandom rnd(ACMRandom::DeterministicSeed());
  DECLARE_ALIGNED(16, tran_low_t, coeff[4096]);
  DECLARE_ALIGNED(16, tran_low_t, dqcoeff[4096]);
  intptr_t block_size;
  int64_t ssz;
  int num_iters = 100000;
  int64_t ref_ssz;
  const int msb = bit_depth_ + 8 - 1;
  for (int i = 0; i < 9; ++i) {
    block_size = 16 << (i % 9);  // All block sizes from 4x4, 8x4 ..64x64
    for (int k = 0; k < 9; k++) {
      for (int j = 0; j < block_size; j++) {
        if (k < 5) {
          if (rnd(2)) {
            // Positive number
            coeff[j] = rnd(1 << msb);
            dqcoeff[j] = rnd(1 << msb);
          } else {
            // Negative number
            coeff[j] = -rnd(1 << msb);
            dqcoeff[j] = -rnd(1 << msb);
          }
        } else {
          if (rnd(2)) {
            // Positive number
            coeff[j] = rnd(1 << 14);
            dqcoeff[j] = rnd(1 << 14);
          } else {
            // Negative number
            coeff[j] = -rnd(1 << 14);
            dqcoeff[j] = -rnd(1 << 14);
          }
        }
      }
      aom_usec_timer ref_timer, test_timer;

      aom_usec_timer_start(&ref_timer);
      for (int iter = 0; iter < num_iters; ++iter) {
        ref_error_block_op_(coeff, dqcoeff, block_size, &ref_ssz, bit_depth_);
      }
      aom_usec_timer_mark(&ref_timer);
      const int elapsed_time_c =
          static_cast<int>(aom_usec_timer_elapsed(&ref_timer));

      aom_usec_timer_start(&test_timer);
      for (int iter = 0; iter < num_iters; ++iter) {
        error_block_op_(coeff, dqcoeff, block_size, &ssz, bit_depth_);
      }
      aom_usec_timer_mark(&test_timer);

      const int elapsed_time_simd =
          static_cast<int>(aom_usec_timer_elapsed(&test_timer));

      printf(
          " c_time=%d \t simd_time=%d \t "
          "gain=%d \n",
          elapsed_time_c, elapsed_time_simd,
          (elapsed_time_c / elapsed_time_simd));
    }
  }
}